

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O2

void __thiscall
QHttp2ProtocolHandler::handleHeadersReceived
          (QHttp2ProtocolHandler *this,HttpHeader *headers,bool endStream)

{
  ContextType *reply;
  QHttpNetworkReplyPrivate *this_00;
  pointer pHVar1;
  char *pcVar2;
  undefined4 uVar3;
  bool bVar4;
  char cVar5;
  int statusCode;
  QObject *object;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *this_01;
  qlonglong qVar6;
  qsizetype qVar7;
  QByteArray *data;
  QHttpNetworkRequestPrivate *pQVar8;
  QNonContiguousByteDevice *pQVar9;
  HeaderField *pair;
  pointer lhs;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QArrayDataPointer<char16_t> local_88;
  bool ok;
  char16_t *pcStack_60;
  undefined1 *local_58;
  QHttp2Stream *stream;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  object = (QObject *)QObject::sender();
  stream = QtPrivate::qobject_cast_helper<QHttp2Stream*,QObject>(object);
  this_01 = QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::operator[]
                      ((QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>
                        *)(this + 0x50),&stream);
  reply = this_01->second;
  this_00 = *(QHttpNetworkReplyPrivate **)&reply->field_0x8;
  pHVar1 = (headers->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  statusCode = 0;
  for (lhs = (headers->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
             _M_impl.super__Vector_impl_data._M_start; lhs != pHVar1; lhs = lhs + 1) {
    local_88.ptr = (char16_t *)(lhs->value).d.ptr;
    local_88.d = (Data *)(lhs->value).d.size;
    _ok = (code *)0x2487c9;
    bVar4 = ::operator==(&lhs->name,(char **)&ok);
    if (bVar4) {
      _ok = (code *)local_88.d;
      if (2 < (long)local_88.d) {
        _ok = (code *)(Data *)0x3;
      }
      pcStack_60 = local_88.ptr;
      statusCode = QByteArrayView::toInt((QByteArrayView *)&ok,(bool *)0x0,10);
      QHttpNetworkReply::setStatusCode((QHttpNetworkReply *)reply,statusCode);
      *(int *)(*(long *)(this + 0x18) + 0x54) = statusCode;
      QVar10 = QByteArrayView::mid((QByteArrayView *)&local_88,4,-1);
      QVar11.m_data = (storage_type *)QVar10.m_size;
      QVar11.m_size = (qsizetype)&ok;
      QString::fromLatin1(QVar11);
      QHttpNetworkReply::setReasonPhrase((QHttpNetworkReply *)reply,(QString *)&ok);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ok);
    }
    else {
      _ok = (code *)0x24cea5;
      bVar4 = ::operator==(&lhs->name,(char **)&ok);
      if (bVar4) {
        QHttpNetworkReply::setMajorVersion
                  ((QHttpNetworkReply *)reply,*(char *)((long)local_88.ptr + 5) + -0x30);
        QHttpNetworkReply::setMinorVersion
                  ((QHttpNetworkReply *)reply,*(char *)((long)local_88.ptr + 7) + -0x30);
      }
      else {
        _ok = (code *)0x241d06;
        bVar4 = ::operator==(&lhs->name,(char **)&ok);
        if (bVar4) {
          _ok = (code *)((ulong)_ok & 0xffffffffffffff00);
          qVar6 = QByteArrayView::toLongLong((QByteArrayView *)&local_88,&ok,10);
          if (ok == true) {
            (**(code **)(*(long *)reply + 0x88))(reply,qVar6);
          }
        }
        else {
          _ok = (code *)0x241d65;
          bVar4 = ::operator==(&lhs->name,(char **)&ok);
          if (bVar4) {
            qVar7 = QByteArrayView::lengthHelperCharArray("\n",2);
            pcVar2 = "\n\n";
          }
          else {
            qVar7 = QByteArrayView::lengthHelperCharArray(", ",3);
            pcVar2 = "\", ";
          }
          QVar10.m_data = pcVar2 + 1;
          _ok = (code *)(lhs->value).d.d;
          pcStack_60 = (char16_t *)(lhs->value).d.ptr;
          local_58 = (undefined1 *)(lhs->value).d.size;
          if ((Data *)_ok != (Data *)0x0) {
            LOCK();
            (((Data *)_ok)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (((Data *)_ok)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QVar10.m_size = qVar7;
          data = QByteArray::replace((QByteArray *)&ok,'\0',QVar10);
          QHttpNetworkReply::appendHeaderField((QHttpNetworkReply *)reply,&lhs->name,data);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&ok);
        }
      }
    }
  }
  if (statusCode - 0x66U < 0x62 || statusCode == 100) {
    QHttpNetworkReplyPrivate::clearHttpLayerInformation(this_00);
  }
  else {
    bVar4 = QHttpNetworkReply::isHttpRedirect(statusCode);
    if (bVar4) {
      bVar4 = QHttpNetworkRequest::isFollowRedirects(&this_01->first);
      if (bVar4) {
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QHttpNetworkConnectionPrivate::parseRedirectResponse
                  ((QHttpNetworkConnectionPrivate *)local_48,reply);
        uVar3 = local_48._8_4_;
        if (local_48._8_4_ == NoError) {
          cVar5 = QUrl::isValid();
          if (cVar5 != '\0') {
            QHttpNetworkReply::setRedirectUrl((QHttpNetworkReply *)reply,(QUrl *)local_48);
          }
        }
        else {
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          _ok = (code *)&DAT_aaaaaaaaaaaaaaaa;
          pcStack_60 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_88.d = (Data *)0x0;
          local_88.ptr = (char16_t *)0x0;
          local_88.size = 0;
          QHttpNetworkConnectionPrivate::errorDetail
                    ((QString *)&ok,*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0x30) + 8),
                     local_48._8_4_,*(QIODevice **)(this + 0x28),(QString *)&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          finishStreamWithError(this,stream,local_48._8_4_,(QString *)&ok);
          QHttp2Stream::sendRST_STREAM((QHttp2Stream *)stream,INTERNAL_ERROR);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ok);
        }
        QUrl::~QUrl((QUrl *)local_48);
        if (uVar3 != NoError) goto LAB_001e1a6a;
      }
    }
    bVar4 = QHttpNetworkReplyPrivate::isCompressed(this_00);
    if (bVar4) {
      pQVar8 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&(this_01->first).d);
      if (pQVar8->autoDecompress == true) {
        QHttpNetworkReplyPrivate::removeAutoDecompressHeader(this_00);
      }
    }
    bVar4 = QHttpNetworkReply::isHttpRedirect(statusCode);
    if (bVar4) {
      pQVar9 = QHttpNetworkRequest::uploadByteDevice(&this_01->first);
      if (pQVar9 != (QNonContiguousByteDevice *)0x0) {
        (**(code **)(*(long *)pQVar9 + 0x80))(pQVar9);
        this_00->totallyUploadedData = 0;
      }
    }
    _ok = QHttpNetworkReply::headerChanged;
    pcStack_60 = (char16_t *)0x0;
    QMetaObject::invokeMethod<void(QHttpNetworkReply::*)()>
              (reply,(offset_in_QHttpNetworkReply_to_subr *)&ok,QueuedConnection);
    if (endStream) {
      finishStream(this,stream,QueuedConnection);
    }
  }
LAB_001e1a6a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::handleHeadersReceived(const HPack::HttpHeader &headers, bool endStream)
{
    QHttp2Stream *stream = qobject_cast<QHttp2Stream *>(sender());
    auto &requestPair = requestReplyPairs[stream];
    auto *httpReply = requestPair.second;
    auto &httpRequest = requestPair.first;
    Q_ASSERT(httpReply || stream->state() == QHttp2Stream::State::ReservedRemote);

    auto *httpReplyPrivate = httpReply->d_func();

    // For HTTP/1 'location' is handled (and redirect URL set) when a protocol
    // handler emits channel->allDone(). Http/2 protocol handler never emits
    // allDone, since we have many requests multiplexed in one channel at any
    // moment and we are probably not done yet. So we extract url and set it
    // here, if needed.
    int statusCode = 0;
    for (const auto &pair : headers) {
        const auto &name = pair.name;
        const auto value = QByteArrayView(pair.value);

        // TODO: part of this code copies what SPDY protocol handler does when
        // processing headers. Binary nature of HTTP/2 and SPDY saves us a lot
        // of parsing and related errors/bugs, but it would be nice to have
        // more detailed validation of headers.
        if (name == ":status") {
            statusCode = value.left(3).toInt();
            httpReply->setStatusCode(statusCode);
            m_channel->lastStatus = statusCode; // Mostly useless for http/2, needed for auth
            httpReply->setReasonPhrase(QString::fromLatin1(value.mid(4)));
        } else if (name == ":version") {
            httpReply->setMajorVersion(value.at(5) - '0');
            httpReply->setMinorVersion(value.at(7) - '0');
        } else if (name == "content-length") {
            bool ok = false;
            const qlonglong length = value.toLongLong(&ok);
            if (ok)
                httpReply->setContentLength(length);
        } else {
            const auto binder = name == "set-cookie" ? QByteArrayView("\n") : QByteArrayView(", ");
            httpReply->appendHeaderField(name, QByteArray(pair.value).replace('\0', binder));
        }
    }

    // Discard all informational (1xx) replies with the exception of 101.
    // Also see RFC 9110 (Chapter 15.2)
    if (statusCode == 100 || (102 <= statusCode && statusCode <= 199)) {
        httpReplyPrivate->clearHttpLayerInformation();
        return;
    }

    if (QHttpNetworkReply::isHttpRedirect(statusCode) && httpRequest.isFollowRedirects()) {
        QHttpNetworkConnectionPrivate::ParseRedirectResult
                result = QHttpNetworkConnectionPrivate::parseRedirectResponse(httpReply);
        if (result.errorCode != QNetworkReply::NoError) {
            auto errorString = m_connection->d_func()->errorDetail(result.errorCode, m_socket);
            finishStreamWithError(stream, result.errorCode, errorString);
            stream->sendRST_STREAM(INTERNAL_ERROR);
            return;
        }

        if (result.redirectUrl.isValid())
            httpReply->setRedirectUrl(result.redirectUrl);
    }

    if (httpReplyPrivate->isCompressed() && httpRequest.d->autoDecompress)
        httpReplyPrivate->removeAutoDecompressHeader();

    if (QHttpNetworkReply::isHttpRedirect(statusCode)) {
        // Note: This status code can trigger uploadByteDevice->reset() in
        // QHttpNetworkConnectionChannel::handleStatus. Alas, we have no single
        // request/reply, we multiplex several requests and thus we never simply
        // call 'handleStatus'. If we have a byte-device - we try to reset it
        // here, we don't (and can't) handle any error during reset operation.
        if (auto *byteDevice = httpRequest.uploadByteDevice()) {
            byteDevice->reset();
            httpReplyPrivate->totallyUploadedData = 0;
        }
    }

    QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::headerChanged, Qt::QueuedConnection);
    if (endStream)
        finishStream(stream, Qt::QueuedConnection);
}